

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O2

void Extra_ThreshSimplifyInequalities
               (int nInequalities,int nChows,unsigned_long **pGreaters,unsigned_long **pSmallers)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  unsigned_long *puVar9;
  long lVar10;
  
  uVar4 = 0;
  uVar5 = (ulong)(uint)nChows;
  if (nChows < 1) {
    uVar5 = uVar4;
  }
  uVar6 = (ulong)(uint)nInequalities;
  if (nInequalities < 1) {
    uVar6 = uVar4;
  }
  for (; uVar4 != uVar6; uVar4 = uVar4 + 1) {
    lVar8 = 0;
    for (lVar7 = 0; uVar5 * 8 != lVar7; lVar7 = lVar7 + 8) {
      puVar1 = pGreaters[uVar4];
      uVar2 = *(ulong *)((long)puVar1 + lVar7);
      uVar3 = *(ulong *)((long)pSmallers[uVar4] + lVar7);
      puVar9 = (unsigned_long *)((long)pSmallers[uVar4] + lVar7);
      lVar10 = uVar2 - uVar3;
      if (lVar10 == 0) {
        *(undefined8 *)((long)puVar1 + lVar7) = 0;
      }
      else if (uVar2 < uVar3 || lVar10 == 0) {
        *puVar9 = uVar3 - uVar2;
        puVar9 = puVar1 + lVar8;
      }
      else {
        *(long *)((long)puVar1 + lVar7) = lVar10;
      }
      *puVar9 = 0;
      lVar8 = lVar8 + 1;
    }
  }
  return;
}

Assistant:

void Extra_ThreshSimplifyInequalities(int nInequalities, int nChows,
        unsigned long ** pGreaters, unsigned long ** pSmallers) {
    int i = 0, k = 0;

    for (k = 0; k < nInequalities; k++) {
        for (i = 0; i < nChows; i++) {
            if ((pGreaters[k][i]) == (pSmallers[k][i])) {
                pGreaters[k][i] = 0;
                pSmallers[k][i] = 0;
            } else if ((pGreaters[k][i]) > (pSmallers[k][i])) {
                pGreaters[k][i] = pGreaters[k][i] - pSmallers[k][i];
                pSmallers[k][i] = 0;
            } else {
                pSmallers[k][i] = pSmallers[k][i] - pGreaters[k][i];
                ;
                pGreaters[k][i] = 0;
            }
        }
    }
//        Extra_ThreshPrintInequalities( pGreaters, pSmallers, nChows, nInequalities);
//        printf( "\nInequalities was Siplified \n");
}